

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerGLSL::should_forward(CompilerGLSL *this,uint32_t id)

{
  ID id_00;
  bool bVar1;
  bool bVar2;
  SPIRVariable *pSVar3;
  SPIRExpression *pSVar4;
  
  pSVar3 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  if (pSVar3 == (SPIRVariable *)0x0) {
    if ((this->options).force_temporary == false) {
      pSVar4 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,id);
      if (pSVar4 == (SPIRExpression *)0x0) goto LAB_00266b59;
      if ((pSVar4->expression_dependencies).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size < 0x40) {
        id_00.id = (pSVar4->loaded_from).id;
        if (id_00.id == 0) {
LAB_00266b59:
          bVar2 = Compiler::is_immutable(&this->super_Compiler,id);
          return bVar2;
        }
        bVar2 = Compiler::has_decoration(&this->super_Compiler,id_00,DecorationBuiltIn);
        if (!bVar2) goto LAB_00266b59;
        bVar2 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar4->loaded_from).id,DecorationVolatile);
        if (!bVar2) goto LAB_00266b59;
      }
    }
    bVar2 = false;
  }
  else {
    bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationBuiltIn);
    bVar2 = true;
    if (bVar1) {
      bVar2 = Compiler::has_decoration(&this->super_Compiler,(ID)id,DecorationVolatile);
      bVar2 = !bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool CompilerGLSL::should_forward(uint32_t id) const
{
	// If id is a variable we will try to forward it regardless of force_temporary check below
	// This is important because otherwise we'll get local sampler copies (highp sampler2D foo = bar) that are invalid in OpenGL GLSL

	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
	{
		// Never forward volatile builtin variables, e.g. SPIR-V 1.6 HelperInvocation.
		return !(has_decoration(id, DecorationBuiltIn) && has_decoration(id, DecorationVolatile));
	}

	// For debugging emit temporary variables for all expressions
	if (options.force_temporary)
		return false;

	// If an expression carries enough dependencies we need to stop forwarding at some point,
	// or we explode compilers. There are usually limits to how much we can nest expressions.
	auto *expr = maybe_get<SPIRExpression>(id);
	const uint32_t max_expression_dependencies = 64;
	if (expr && expr->expression_dependencies.size() >= max_expression_dependencies)
		return false;

	if (expr && expr->loaded_from
		&& has_decoration(expr->loaded_from, DecorationBuiltIn)
		&& has_decoration(expr->loaded_from, DecorationVolatile))
	{
		// Never forward volatile builtin variables, e.g. SPIR-V 1.6 HelperInvocation.
		return false;
	}

	// Immutable expression can always be forwarded.
	if (is_immutable(id))
		return true;

	return false;
}